

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::NormalizedFresnelBxDF::f
          (NormalizedFresnelBxDF *this,Vector3f *wo,Vector3f *wi,TransportMode mode)

{
  undefined1 auVar1 [16];
  Float FVar2;
  undefined1 auVar3 [64];
  SampledSpectrum f;
  SampledSpectrum local_28;
  undefined1 extraout_var [60];
  
  if ((wo->super_Tuple3<pbrt::Vector3,_float>).z * (wi->super_Tuple3<pbrt::Vector3,_float>).z <= 0.0
     ) {
    SampledSpectrum::SampledSpectrum(&local_28,0.0);
  }
  else {
    auVar3._0_4_ = FresnelMoment1(1.0 / this->eta);
    auVar3._4_60_ = extraout_var;
    auVar1 = vfmadd132ss_fma(auVar3._0_16_,SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
    FVar2 = FrDielectric((wi->super_Tuple3<pbrt::Vector3,_float>).z,this->eta);
    SampledSpectrum::SampledSpectrum(&local_28,(1.0 - FVar2) / (auVar1._0_4_ * 3.1415927));
    if (mode == Radiance) {
      SampledSpectrum::operator*=(&local_28,this->eta * this->eta);
    }
  }
  return (array<float,_4>)(array<float,_4>)local_28;
}

Assistant:

f(const Vector3f &wo, const Vector3f &wi, TransportMode mode) const {
        if (!SameHemisphere(wo, wi))
            return SampledSpectrum(0.f);
        // Compute $\Sw$ factor for BSSRDF value
        Float c = 1 - 2 * FresnelMoment1(1 / eta);
        SampledSpectrum f((1 - FrDielectric(CosTheta(wi), eta)) / (c * Pi));

        // Update BSSRDF transmission term to account for adjoint light transport
        if (mode == TransportMode::Radiance)
            f *= Sqr(eta);

        return f;
    }